

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O2

void hmm_init(hmm_context_t *ctx,hmm_t *hmm,int mpx,int ssid,int tmatid)

{
  uint uVar1;
  long lVar2;
  
  hmm->ctx = ctx;
  hmm->mpx = (uint8)mpx;
  uVar1 = ctx->n_emit_state;
  hmm->n_emit_state = (uint8)uVar1;
  if (mpx == 0) {
    hmm->ssid = (uint16)ssid;
    memcpy(hmm->senid,ctx->sseq[ssid],(ulong)((uVar1 & 0xff) * 2));
  }
  else {
    hmm->ssid = 0xffff;
    hmm->senid[0] = (uint16)ssid;
    for (lVar2 = 0x1e; lVar2 - 0x1dU < (ulong)(uVar1 & 0xff); lVar2 = lVar2 + 1) {
      *(undefined2 *)((long)hmm->score + lVar2 * 2 + -8) = 0xffff;
    }
  }
  hmm->tmatid = (int16)tmatid;
  hmm_clear(hmm);
  return;
}

Assistant:

void
hmm_init(hmm_context_t *ctx, hmm_t *hmm, int mpx, int ssid, int tmatid)
{
    hmm->ctx = ctx;
    hmm->mpx = mpx;
    hmm->n_emit_state = ctx->n_emit_state;
    if (mpx) {
        int i;
        hmm->ssid = BAD_SSID;
        hmm->senid[0] = ssid;
        for (i = 1; i < hmm_n_emit_state(hmm); ++i) {
            hmm->senid[i] = BAD_SSID;
        }
    }
    else {
        hmm->ssid = ssid;
        memcpy(hmm->senid, ctx->sseq[ssid], hmm->n_emit_state * sizeof(*hmm->senid));
    }
    hmm->tmatid = tmatid;
    hmm_clear(hmm);
}